

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtContextCore.cpp
# Opt level: O3

JsErrorCode __thiscall
ChakraCoreStreamWriter::SetTransferableVars
          (ChakraCoreStreamWriter *this,JsValueRef *transferableVars,size_t transferableVarsCount)

{
  code *pcVar1;
  bool bVar2;
  JsErrorCode JVar3;
  undefined4 *puVar4;
  Serializer *this_00;
  
  this_00 = this->m_serializerCore;
  if (this_00 == (Serializer *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Core/JsrtContextCore.cpp"
                       ,0x100,"(m_serializerCore)","m_serializerCore");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    this_00 = this->m_serializerCore;
  }
  JVar3 = Js::SCACore::Serializer::SetTransferableVars
                    (this_00,transferableVars,transferableVarsCount);
  if (JVar3 != JsNoError) {
    if (JVar3 == 0x80041004) {
      JVar3 = JsTransferableAlreadyDetached;
    }
    else if (JVar3 == 0x80041003) {
      JVar3 = JsTransferableNotSupported;
    }
    else {
      JVar3 = JsSerializerNotSupported;
    }
  }
  return JVar3;
}

Assistant:

JsErrorCode ChakraCoreStreamWriter::SetTransferableVars(JsValueRef *transferableVars, size_t transferableVarsCount)
{
    Assert(m_serializerCore);
    HRESULT hr = m_serializerCore->SetTransferableVars((Js::Var *)transferableVars, transferableVarsCount);
    if (hr == S_OK)
    {
        return JsNoError;
    }
    else if (hr == E_SCA_TRANSFERABLE_UNSUPPORTED)
    {
        return JsTransferableNotSupported;
    }
    else if (hr == E_SCA_TRANSFERABLE_NEUTERED)
    {
        return JsTransferableAlreadyDetached;
    }
    return JsSerializerNotSupported;
}